

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  undefined1 *puVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  size_t _elemsize;
  long lVar30;
  ulong *puVar31;
  long lVar32;
  long lVar33;
  undefined1 (*pauVar34) [16];
  int iVar35;
  undefined1 *puVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar46 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  long local_f0;
  undefined1 local_c8 [64];
  size_t local_88;
  ulong local_80;
  undefined1 local_78 [32];
  ulong local_50;
  ulong local_48;
  long local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  iVar38 = bottom_im2col->h;
  local_78._0_8_ = bottom_im2col;
  uVar29 = bottom_im2col->c;
  lVar39 = (long)(int)uVar29;
  local_80 = (ulong)(uint)top_blob->c;
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar16 = uVar1;
  iVar24 = iVar38;
  if (lVar39 < 4) {
    uVar19 = uVar29;
    if ((int)uVar1 < 4) {
      iVar35 = 1;
      _elemsize = 1;
      if ((int)uVar1 < 2) goto LAB_00273252;
      iVar24 = iVar38 * 2;
      uVar16 = (uVar1 & 1) + 1;
    }
    else {
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
      iVar24 = iVar38 * 4;
    }
    iVar35 = 1;
    _elemsize = 1;
  }
  else {
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        iVar35 = 4;
        _elemsize = 4;
        uVar19 = (uVar29 & 3) + (uVar29 >> 2);
        goto LAB_00273252;
      }
      iVar24 = iVar38 * 2;
      uVar19 = (uVar29 & 3) + (uVar29 >> 2);
      uVar16 = (uVar1 & 1) + 1;
    }
    else {
      iVar24 = iVar38 * 4;
      uVar19 = (uVar29 & 3) + (uVar29 >> 2);
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar35 = 4;
    _elemsize = 4;
  }
LAB_00273252:
  local_38 = top_blob;
  Mat::create((Mat *)local_c8,iVar24,uVar19,uVar16,_elemsize,iVar35,opt->workspace_allocator);
  uVar22 = (ulong)uVar29;
  uVar15 = (ulong)(int)uVar1;
  uVar16 = (int)uVar1 >> 2;
  if (0 < (int)uVar16) {
    local_50 = (ulong)uVar16;
    local_f0 = 3;
    lVar32 = 1;
    uVar41 = 0;
    do {
      puVar36 = (undefined1 *)(local_88 * uVar41 * local_c8._16_8_ + local_c8._0_8_);
      if ((int)uVar29 < 4) {
        uVar21 = 0;
      }
      else {
        lVar37 = 3;
        lVar20 = 2;
        lVar40 = 1;
        uVar25 = 0;
        do {
          if (0 < iVar38) {
            lVar30 = *(long *)(local_78._0_8_ + 0x10) * *(long *)(local_78._0_8_ + 0x40);
            lVar23 = lVar30 * lVar37;
            lVar27 = *(long *)local_78._0_8_ + local_f0;
            lVar33 = lVar30 * lVar20;
            lVar17 = lVar30 * uVar25;
            lVar30 = lVar30 * lVar40;
            iVar24 = iVar38;
            do {
              *puVar36 = *(undefined1 *)(lVar27 + -3 + lVar17);
              puVar36[1] = *(undefined1 *)(lVar27 + -3 + lVar30);
              puVar36[2] = *(undefined1 *)(lVar27 + -3 + lVar33);
              puVar36[3] = *(undefined1 *)(lVar27 + -3 + lVar23);
              puVar36[4] = *(undefined1 *)(lVar27 + -2 + lVar17);
              puVar36[5] = *(undefined1 *)(lVar27 + -2 + lVar30);
              puVar36[6] = *(undefined1 *)(lVar27 + -2 + lVar33);
              puVar36[7] = *(undefined1 *)(lVar27 + -2 + lVar23);
              puVar36[8] = *(undefined1 *)(lVar27 + -1 + lVar17);
              puVar36[9] = *(undefined1 *)(lVar27 + -1 + lVar30);
              puVar36[10] = *(undefined1 *)(lVar27 + -1 + lVar33);
              puVar36[0xb] = *(undefined1 *)(lVar27 + -1 + lVar23);
              puVar36[0xc] = *(undefined1 *)(lVar27 + lVar17);
              puVar36[0xd] = *(undefined1 *)(lVar27 + lVar30);
              puVar36[0xe] = *(undefined1 *)(lVar27 + lVar33);
              puVar36[0xf] = *(undefined1 *)(lVar27 + lVar23);
              puVar36 = puVar36 + 0x10;
              lVar27 = lVar27 + (ulong)uVar1;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar21 = uVar25 + 4;
          lVar17 = uVar25 + 7;
          lVar37 = lVar37 + 4;
          lVar20 = lVar20 + 4;
          lVar40 = lVar40 + 4;
          uVar25 = uVar21;
          local_48 = uVar41;
          local_40 = lVar32;
        } while (lVar17 < lVar39);
      }
      if ((int)uVar21 < (int)uVar29) {
        uVar21 = uVar21 & 0xffffffff;
        do {
          if (0 < iVar38) {
            puVar18 = (undefined1 *)
                      (*(long *)(local_78._0_8_ + 0x40) * *(long *)(local_78._0_8_ + 0x10) * uVar21
                      + *(long *)local_78._0_8_ + lVar32);
            iVar24 = iVar38;
            do {
              *puVar36 = puVar18[-1];
              puVar36[1] = *puVar18;
              puVar36[2] = puVar18[1];
              puVar36[3] = puVar18[2];
              puVar36 = puVar36 + 4;
              puVar18 = puVar18 + uVar1;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
      }
      uVar41 = uVar41 + 1;
      local_f0 = local_f0 + 4;
      lVar32 = lVar32 + 4;
    } while (uVar41 != local_50);
  }
  uVar41 = uVar15 & 0xfffffffffffffffc;
  uVar19 = uVar1 >> 1 & 1;
  if (uVar19 != 0) {
    puVar36 = (undefined1 *)((long)(int)uVar16 * local_88 * local_c8._16_8_ + local_c8._0_8_);
    uVar21 = 0;
    if (3 < (int)uVar29) {
      lVar32 = 1;
      lVar20 = 2;
      lVar37 = 3;
      uVar25 = 0;
      do {
        if (0 < iVar38) {
          lVar40 = *(long *)local_78._0_8_;
          lVar30 = *(long *)(local_78._0_8_ + 0x10) * *(long *)(local_78._0_8_ + 0x40);
          lVar17 = lVar30 * uVar25 + lVar40 + 1;
          lVar27 = lVar40 + lVar30 * lVar32 + 1;
          lVar23 = lVar30 * lVar20 + lVar40 + 1;
          lVar40 = lVar40 + lVar30 * lVar37 + 1;
          iVar24 = iVar38;
          do {
            *puVar36 = *(undefined1 *)(lVar17 + -1 + uVar41);
            puVar36[1] = *(undefined1 *)(lVar27 + -1 + uVar41);
            puVar36[2] = *(undefined1 *)(lVar23 + -1 + uVar41);
            puVar36[3] = *(undefined1 *)(lVar40 + -1 + uVar41);
            puVar36[4] = *(undefined1 *)(lVar17 + uVar41);
            puVar36[5] = *(undefined1 *)(lVar27 + uVar41);
            puVar36[6] = *(undefined1 *)(lVar23 + uVar41);
            puVar36[7] = *(undefined1 *)(lVar40 + uVar41);
            puVar36 = puVar36 + 8;
            lVar17 = lVar17 + uVar15;
            lVar27 = lVar27 + uVar15;
            lVar23 = lVar23 + uVar15;
            lVar40 = lVar40 + uVar15;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
        }
        uVar21 = uVar25 + 4;
        lVar40 = uVar25 + 7;
        lVar32 = lVar32 + 4;
        lVar20 = lVar20 + 4;
        lVar37 = lVar37 + 4;
        uVar25 = uVar21;
      } while (lVar40 < lVar39);
    }
    if ((int)uVar21 < (int)uVar29) {
      uVar21 = uVar21 & 0xffffffff;
      do {
        if (0 < iVar38) {
          puVar18 = (undefined1 *)
                    (*(long *)(local_78._0_8_ + 0x40) * *(long *)(local_78._0_8_ + 0x10) * uVar21 +
                    *(long *)local_78._0_8_ + uVar41 + 1);
          iVar24 = iVar38;
          do {
            *puVar36 = puVar18[-1];
            puVar36[1] = *puVar18;
            puVar36 = puVar36 + 2;
            puVar18 = puVar18 + uVar15;
            iVar24 = iVar24 + -1;
          } while (iVar24 != 0);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar22);
    }
  }
  iVar24 = (int)uVar41 + uVar19 * 2;
  if (iVar24 < (int)uVar1) {
    uVar41 = (ulong)iVar24;
    do {
      iVar24 = (int)uVar41;
      iVar35 = iVar24 + 3;
      if (-1 < iVar24) {
        iVar35 = iVar24;
      }
      puVar36 = (undefined1 *)
                (local_c8._16_8_ * local_88 *
                 (long)(int)((iVar24 - (((uint)(uVar41 >> 0x1f) & 1) + iVar24 & 0xfffffffe)) +
                             (iVar35 >> 2) +
                            (int)((char)((char)uVar41 - ((byte)iVar35 & 0xfc)) / '\x02')) +
                local_c8._0_8_);
      if ((int)uVar29 < 4) {
        uVar21 = 0;
      }
      else {
        lVar32 = 1;
        lVar20 = 2;
        lVar37 = 3;
        uVar25 = 0;
        do {
          if (0 < iVar38) {
            lVar40 = *(long *)(local_78._0_8_ + 0x10) * *(long *)(local_78._0_8_ + 0x40);
            lVar17 = *(long *)local_78._0_8_ + uVar41;
            iVar24 = iVar38;
            do {
              *puVar36 = *(undefined1 *)(lVar17 + lVar40 * uVar25);
              puVar36[1] = *(undefined1 *)(lVar17 + lVar40 * lVar32);
              puVar36[2] = *(undefined1 *)(lVar17 + lVar40 * lVar20);
              puVar36[3] = *(undefined1 *)(lVar17 + lVar40 * lVar37);
              puVar36 = puVar36 + 4;
              lVar17 = lVar17 + uVar15;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar21 = uVar25 + 4;
          lVar40 = uVar25 + 7;
          lVar32 = lVar32 + 4;
          lVar20 = lVar20 + 4;
          lVar37 = lVar37 + 4;
          uVar25 = uVar21;
        } while (lVar40 < lVar39);
      }
      if ((int)uVar21 < (int)uVar29) {
        uVar21 = uVar21 & 0xffffffff;
        do {
          if (0 < iVar38) {
            puVar18 = (undefined1 *)
                      (*(long *)(local_78._0_8_ + 0x40) * uVar21 * *(long *)(local_78._0_8_ + 0x10)
                       + *(long *)local_78._0_8_ + uVar41);
            iVar24 = iVar38;
            do {
              *puVar36 = *puVar18;
              puVar36 = puVar36 + 1;
              puVar18 = puVar18 + uVar15;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar22);
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != uVar15);
  }
  if (0 < (int)local_80) {
    uVar16 = uVar29 + 3;
    if (-1 < (int)uVar29) {
      uVar16 = uVar29;
    }
    iVar24 = ((int)uVar16 >> 2) * iVar38;
    iVar38 = ((int)uVar29 % 4) * iVar38;
    uVar22 = 0;
    do {
      pauVar26 = (undefined1 (*) [16])
                 (local_38->cstep * uVar22 * local_38->elemsize + (long)local_38->data);
      if ((int)uVar1 < 4) {
        uVar41 = 0;
      }
      else {
        uVar21 = 0;
        do {
          pauVar28 = (undefined1 (*) [16])
                     ((uVar21 >> 2) * local_88 * local_c8._16_8_ + local_c8._0_8_);
          pauVar34 = (undefined1 (*) [16])
                     (kernel->cstep * uVar22 * kernel->elemsize + (long)kernel->data);
          auVar46 = ZEXT1664((undefined1  [16])0x0);
          if (iVar24 < 1) {
            auVar49 = ZEXT1664((undefined1  [16])0x0);
          }
          else {
            auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            auVar53 = ZEXT1664((undefined1  [16])0x0);
            auVar55 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar54 = ZEXT1664((undefined1  [16])0x0);
            iVar35 = iVar24;
            do {
              local_78 = auVar56._0_32_;
              auVar2 = vpmovsxbw_avx2(*pauVar28);
              auVar11 = vpermq_avx2(auVar2,0x50);
              auVar12 = vpermq_avx2(auVar2,0xfa);
              auVar3 = vpmovsxbw_avx2(*pauVar34);
              auVar13 = vpermq_avx2(auVar2,5);
              auVar2 = vpermq_avx2(auVar2,0xaf);
              auVar5 = vpmullw_avx2(auVar11,auVar3);
              auVar11 = vpmulhw_avx2(auVar11,auVar3);
              auVar6 = vpmullw_avx2(auVar13,auVar3);
              auVar13 = vpmulhw_avx2(auVar13,auVar3);
              auVar7 = vpmullw_avx2(auVar12,auVar3);
              auVar12 = vpmulhw_avx2(auVar12,auVar3);
              auVar8 = vpmullw_avx2(auVar2,auVar3);
              auVar4 = vpmulhw_avx2(auVar2,auVar3);
              auVar2 = vpunpcklwd_avx2(auVar5,auVar11);
              auVar2 = vpaddd_avx2(auVar2,auVar46._0_32_);
              auVar46 = ZEXT3264(auVar2);
              auVar3 = vpunpcklwd_avx2(auVar6,auVar13);
              auVar3 = vpaddd_avx2(auVar3,auVar51._0_32_);
              auVar51 = ZEXT3264(auVar3);
              auVar11 = vpunpckhwd_avx2(auVar5,auVar11);
              auVar11 = vpaddd_avx2(auVar11,auVar53._0_32_);
              auVar53 = ZEXT3264(auVar11);
              auVar13 = vpunpckhwd_avx2(auVar6,auVar13);
              auVar13 = vpaddd_avx2(auVar55._0_32_,auVar13);
              auVar55 = ZEXT3264(auVar13);
              auVar5 = vpunpcklwd_avx2(auVar7,auVar12);
              auVar5 = vpaddd_avx2(local_78,auVar5);
              auVar56 = ZEXT3264(auVar5);
              auVar6 = vpunpcklwd_avx2(auVar8,auVar4);
              auVar6 = vpaddd_avx2(auVar6,auVar49._0_32_);
              auVar49 = ZEXT3264(auVar6);
              auVar12 = vpunpckhwd_avx2(auVar7,auVar12);
              auVar12 = vpaddd_avx2(auVar50._0_32_,auVar12);
              auVar50 = ZEXT3264(auVar12);
              auVar4 = vpunpckhwd_avx2(auVar8,auVar4);
              auVar4 = vpaddd_avx2(auVar54._0_32_,auVar4);
              auVar54 = ZEXT3264(auVar4);
              pauVar28 = pauVar28 + 1;
              pauVar34 = pauVar34 + 1;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
            auVar7 = vpunpckldq_avx2(auVar2,auVar3);
            auVar8 = vpunpckldq_avx2(auVar11,auVar13);
            auVar3 = vpunpckhdq_avx2(auVar2,auVar3);
            auVar11 = vpunpckhdq_avx2(auVar11,auVar13);
            auVar9 = vpunpckldq_avx2(auVar5,auVar6);
            auVar10 = vpunpckldq_avx2(auVar12,auVar4);
            auVar13 = vpunpckhdq_avx2(auVar5,auVar6);
            auVar5 = vpunpckhdq_avx2(auVar12,auVar4);
            auVar2 = vpunpckhdq_avx2(auVar7,auVar8);
            auVar6 = vpermq_avx2(auVar2,0x9c);
            auVar2 = vpunpckldq_avx2(auVar7,auVar8);
            auVar2 = vpermq_avx2(auVar2,0x9c);
            auVar2 = vpaddd_avx2(auVar2,auVar6);
            auVar6 = vpunpckhdq_avx2(auVar3,auVar11);
            auVar6 = vpermq_avx2(auVar6,0x9c);
            auVar3 = vpunpckldq_avx2(auVar3,auVar11);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpaddd_avx2(auVar6,auVar3);
            auVar2 = vpaddd_avx2(auVar2,auVar3);
            auVar49 = ZEXT3264(auVar2);
            auVar2 = vpunpckhdq_avx2(auVar9,auVar10);
            auVar3 = vpermq_avx2(auVar2,0x9c);
            auVar2 = vpunpckldq_avx2(auVar9,auVar10);
            auVar2 = vpermq_avx2(auVar2,0x9c);
            auVar2 = vpaddd_avx2(auVar2,auVar3);
            auVar3 = vpunpckhdq_avx2(auVar13,auVar5);
            auVar11 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpunpckldq_avx2(auVar13,auVar5);
            auVar3 = vpermq_avx2(auVar3,0x9c);
            auVar3 = vpaddd_avx2(auVar11,auVar3);
            auVar2 = vpaddd_avx2(auVar2,auVar3);
            auVar46 = ZEXT3264(auVar2);
          }
          auVar45 = auVar46._0_16_;
          auVar52 = auVar49._0_16_;
          auVar44 = auVar49._16_16_;
          auVar47 = auVar46._16_16_;
          if (0 < iVar38) {
            lVar39 = 0;
            do {
              auVar52 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar28 + lVar39 * 4)));
              auVar52 = vpshuflw_avx(auVar52,0x50);
              auVar45 = vpshufd_avx(auVar52,0x50);
              auVar52 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar28 + lVar39 * 4 + 2)));
              auVar52 = vpshuflw_avx(auVar52,0x50);
              auVar43 = vpshufd_avx(auVar52,0x50);
              auVar52 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar34 + lVar39 * 4)));
              auVar52._8_8_ = auVar52._0_8_;
              auVar48 = vpmullw_avx(auVar52,auVar45);
              auVar45 = vpmulhw_avx(auVar45,auVar52);
              auVar42 = vpmullw_avx(auVar52,auVar43);
              auVar43 = vpmulhw_avx(auVar43,auVar52);
              auVar52 = vpunpcklwd_avx(auVar48,auVar45);
              auVar52 = vpaddd_avx(auVar49._0_16_,auVar52);
              auVar49 = ZEXT1664(auVar52);
              auVar45 = vpunpckhwd_avx(auVar48,auVar45);
              auVar44 = vpaddd_avx(auVar44,auVar45);
              auVar45 = vpunpcklwd_avx(auVar42,auVar43);
              auVar45 = vpaddd_avx(auVar46._0_16_,auVar45);
              auVar46 = ZEXT1664(auVar45);
              auVar43 = vpunpckhwd_avx(auVar42,auVar43);
              auVar47 = vpaddd_avx(auVar47,auVar43);
              lVar39 = lVar39 + 1;
            } while (iVar38 != (int)lVar39);
          }
          *pauVar26 = auVar52;
          pauVar26[1] = auVar44;
          pauVar26[2] = auVar45;
          pauVar26[3] = auVar47;
          pauVar26 = pauVar26 + 4;
          uVar41 = uVar21 + 4;
          lVar39 = uVar21 + 7;
          uVar21 = uVar41;
        } while (lVar39 < (long)uVar15);
      }
      uVar29 = (uint)uVar41 | 1;
      while (uVar16 = (uint)uVar41, (int)uVar29 < (int)uVar1) {
        pauVar28 = (undefined1 (*) [16])
                   (local_c8._16_8_ * local_88 *
                    (ulong)(((uint)(uVar41 >> 2) & 0x3fffffff) + (uint)((uVar16 >> 1 & 1) != 0)) +
                   local_c8._0_8_);
        pauVar34 = (undefined1 (*) [16])
                   (kernel->cstep * uVar22 * kernel->elemsize + (long)kernel->data);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        if (0 < iVar24) {
          auVar49 = ZEXT1664((undefined1  [16])0x0);
          auVar50 = ZEXT1664((undefined1  [16])0x0);
          auVar51 = ZEXT1664((undefined1  [16])0x0);
          iVar35 = iVar24;
          do {
            auVar2 = vpmovsxbw_avx2(*pauVar28);
            auVar11 = vpermq_avx2(auVar2,0x50);
            auVar3 = vpmovsxbw_avx2(*pauVar34);
            auVar2 = vpermq_avx2(auVar2,5);
            auVar5 = vpmullw_avx2(auVar11,auVar3);
            auVar11 = vpmulhw_avx2(auVar11,auVar3);
            auVar6 = vpmullw_avx2(auVar2,auVar3);
            auVar13 = vpmulhw_avx2(auVar2,auVar3);
            auVar2 = vpunpcklwd_avx2(auVar5,auVar11);
            auVar2 = vpaddd_avx2(auVar51._0_32_,auVar2);
            auVar51 = ZEXT3264(auVar2);
            auVar3 = vpunpcklwd_avx2(auVar6,auVar13);
            auVar3 = vpaddd_avx2(auVar50._0_32_,auVar3);
            auVar50 = ZEXT3264(auVar3);
            auVar11 = vpunpckhwd_avx2(auVar5,auVar11);
            auVar11 = vpaddd_avx2(auVar49._0_32_,auVar11);
            auVar49 = ZEXT3264(auVar11);
            auVar13 = vpunpckhwd_avx2(auVar6,auVar13);
            auVar13 = vpaddd_avx2(auVar46._0_32_,auVar13);
            auVar46 = ZEXT3264(auVar13);
            pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
            pauVar34 = pauVar34 + 1;
            iVar35 = iVar35 + -1;
          } while (iVar35 != 0);
          auVar5 = vpunpckldq_avx2(auVar2,auVar3);
          auVar6 = vpunpckldq_avx2(auVar11,auVar13);
          auVar3 = vpunpckhdq_avx2(auVar2,auVar3);
          auVar11 = vpunpckhdq_avx2(auVar11,auVar13);
          auVar2 = vpunpckhdq_avx2(auVar5,auVar6);
          auVar13 = vpermq_avx2(auVar2,0x9c);
          auVar2 = vpunpckldq_avx2(auVar5,auVar6);
          auVar2 = vpermq_avx2(auVar2,0x9c);
          auVar2 = vpaddd_avx2(auVar2,auVar13);
          auVar13 = vpunpckhdq_avx2(auVar3,auVar11);
          auVar13 = vpermq_avx2(auVar13,0x9c);
          auVar3 = vpunpckldq_avx2(auVar3,auVar11);
          auVar3 = vpermq_avx2(auVar3,0x9c);
          auVar3 = vpaddd_avx2(auVar13,auVar3);
          auVar2 = vpaddd_avx2(auVar2,auVar3);
          auVar46 = ZEXT3264(auVar2);
        }
        auVar52 = auVar46._0_16_;
        auVar44 = auVar46._16_16_;
        if (0 < iVar38) {
          lVar39 = 0;
          do {
            auVar52 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar28 + lVar39 * 2)));
            auVar52 = vpshuflw_avx(auVar52,0x50);
            auVar43 = vpshufd_avx(auVar52,0x50);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)(*pauVar34 + lVar39 * 4);
            auVar52 = vpmovsxbw_avx(auVar45);
            auVar48._0_8_ = auVar52._0_8_;
            auVar48._8_8_ = auVar48._0_8_;
            auVar47 = vpmullw_avx(auVar43,auVar48);
            auVar45 = vpmulhw_avx(auVar43,auVar48);
            auVar52 = vpunpcklwd_avx(auVar47,auVar45);
            auVar52 = vpaddd_avx(auVar46._0_16_,auVar52);
            auVar46 = ZEXT1664(auVar52);
            auVar45 = vpunpckhwd_avx(auVar47,auVar45);
            auVar44 = vpaddd_avx(auVar44,auVar45);
            lVar39 = lVar39 + 1;
          } while (iVar38 != (int)lVar39);
        }
        *pauVar26 = auVar52;
        pauVar26[1] = auVar44;
        pauVar26 = pauVar26 + 2;
        uVar41 = (ulong)(uVar16 + 2);
        uVar29 = uVar16 + 3;
      }
      if ((int)uVar16 < (int)uVar1) {
        do {
          uVar29 = (uint)uVar41;
          puVar31 = (ulong *)(local_c8._16_8_ * local_88 *
                              (ulong)((uVar29 & 1) + ((uint)(uVar41 >> 2) & 0x3fffffff) +
                                     (uint)((uVar29 >> 1 & 1) != 0)) + local_c8._0_8_);
          pauVar28 = (undefined1 (*) [16])
                     (kernel->cstep * uVar22 * kernel->elemsize + (long)kernel->data);
          auVar46 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar24) {
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            auVar50 = ZEXT1664((undefined1  [16])0x0);
            auVar51 = ZEXT1664((undefined1  [16])0x0);
            iVar35 = iVar24;
            do {
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *puVar31;
              auVar45 = vpmovsxbw_avx(auVar44);
              auVar52 = *pauVar28;
              auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar52);
              auVar47 = vpunpcklbw_avx(auVar52,auVar44);
              auVar52 = vpunpckhbw_avx(auVar52,auVar44);
              auVar42._0_8_ = auVar45._0_8_;
              auVar42._8_8_ = auVar42._0_8_;
              auVar45 = vpmullw_avx(auVar42,auVar47);
              auVar44 = vpmulhw_avx(auVar42,auVar47);
              auVar43 = vpmullw_avx(auVar42,auVar52);
              auVar47 = vpmulhw_avx(auVar42,auVar52);
              auVar52 = vpunpcklwd_avx(auVar45,auVar44);
              auVar52 = vpaddd_avx(auVar51._0_16_,auVar52);
              auVar51 = ZEXT1664(auVar52);
              auVar44 = vpunpckhwd_avx(auVar45,auVar44);
              auVar44 = vpaddd_avx(auVar50._0_16_,auVar44);
              auVar50 = ZEXT1664(auVar44);
              auVar45 = vpunpcklwd_avx(auVar43,auVar47);
              auVar45 = vpaddd_avx(auVar49._0_16_,auVar45);
              auVar49 = ZEXT1664(auVar45);
              auVar47 = vpunpckhwd_avx(auVar43,auVar47);
              auVar47 = vpaddd_avx(auVar46._0_16_,auVar47);
              auVar46 = ZEXT1664(auVar47);
              puVar31 = (ulong *)((long)puVar31 + 4);
              pauVar28 = pauVar28 + 1;
              iVar35 = iVar35 + -1;
            } while (iVar35 != 0);
            auVar43 = vpunpckldq_avx(auVar52,auVar44);
            auVar48 = vpunpckldq_avx(auVar45,auVar47);
            auVar44 = vpunpckhdq_avx(auVar52,auVar44);
            auVar45 = vpunpckhdq_avx(auVar45,auVar47);
            auVar47 = vpunpcklqdq_avx(auVar43,auVar48);
            auVar52 = vpunpckhqdq_avx(auVar43,auVar48);
            auVar52 = vpaddd_avx(auVar47,auVar52);
            auVar47 = vpunpcklqdq_avx(auVar44,auVar45);
            auVar44 = vpunpckhqdq_avx(auVar44,auVar45);
            auVar44 = vpaddd_avx(auVar44,auVar47);
            auVar52 = vpaddd_avx(auVar52,auVar44);
            auVar46 = ZEXT1664(auVar52);
          }
          auVar52 = auVar46._0_16_;
          if (0 < iVar38) {
            lVar39 = 0;
            do {
              auVar43._0_2_ = (short)*(char *)((long)puVar31 + lVar39);
              auVar43._2_2_ = auVar43._0_2_;
              auVar43._4_2_ = auVar43._0_2_;
              auVar43._6_2_ = auVar43._0_2_;
              auVar43._8_2_ = auVar43._0_2_;
              auVar43._10_2_ = auVar43._0_2_;
              auVar43._12_2_ = auVar43._0_2_;
              auVar43._14_2_ = auVar43._0_2_;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = *(ulong *)(*pauVar28 + lVar39 * 4);
              auVar52 = vpmovsxbw_avx(auVar47);
              auVar44 = vpmullw_avx(auVar43,auVar52);
              auVar52 = vpmulhw_avx(auVar43,auVar52);
              auVar52 = vpunpcklwd_avx(auVar44,auVar52);
              auVar52 = vpaddd_avx(auVar46._0_16_,auVar52);
              auVar46 = ZEXT1664(auVar52);
              lVar39 = lVar39 + 1;
            } while (iVar38 != (int)lVar39);
          }
          *pauVar26 = auVar52;
          pauVar26 = pauVar26 + 1;
          uVar41 = (ulong)(uVar29 + 1);
        } while (uVar29 + 1 != uVar1);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != local_80);
  }
  piVar14 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_c8._0_8_ != (void *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}